

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O3

bool trim(string *s)

{
  char *pcVar1;
  char *pcVar2;
  pointer pcVar3;
  ulong uVar4;
  void *pvVar5;
  char *pcVar6;
  pointer pcVar7;
  long lVar8;
  pointer pcVar9;
  char *pcVar10;
  pointer pcVar11;
  
  uVar4 = std::__cxx11::string::find((char)s,0x23);
  if (uVar4 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)s,uVar4);
  }
  pcVar2 = (s->_M_dataplus)._M_p;
  uVar4 = s->_M_string_length;
  pcVar1 = pcVar2 + uVar4;
  pcVar6 = pcVar2;
  if (0 < (long)uVar4 >> 2) {
    pcVar6 = pcVar2 + (uVar4 & 0xfffffffffffffffc);
    lVar8 = ((long)uVar4 >> 2) + 1;
    pcVar10 = pcVar2 + 3;
    do {
      pvVar5 = memchr(" \t\r\n",(int)pcVar10[-3],5);
      if (pvVar5 == (void *)0x0) {
        pcVar10 = pcVar10 + -3;
        goto LAB_0010a64c;
      }
      pvVar5 = memchr(" \t\r\n",(int)pcVar10[-2],5);
      if (pvVar5 == (void *)0x0) {
        pcVar10 = pcVar10 + -2;
        goto LAB_0010a64c;
      }
      pvVar5 = memchr(" \t\r\n",(int)pcVar10[-1],5);
      if (pvVar5 == (void *)0x0) {
        pcVar10 = pcVar10 + -1;
        goto LAB_0010a64c;
      }
      pvVar5 = memchr(" \t\r\n",(int)*pcVar10,5);
      if (pvVar5 == (void *)0x0) goto LAB_0010a64c;
      lVar8 = lVar8 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar8);
  }
  lVar8 = (long)pcVar1 - (long)pcVar6;
  if (lVar8 == 1) {
LAB_0010a618:
    pvVar5 = memchr(" \t\r\n",(int)*pcVar6,5);
    pcVar10 = pcVar6;
    if (pvVar5 != (void *)0x0) {
      pcVar10 = pcVar1;
    }
LAB_0010a64c:
    if (pcVar1 == pcVar10) goto LAB_0010a663;
    std::__cxx11::string::_M_erase((ulong)s,0);
  }
  else {
    if (lVar8 == 2) {
LAB_0010a5fb:
      pvVar5 = memchr(" \t\r\n",(int)*pcVar6,5);
      pcVar10 = pcVar6;
      if (pvVar5 != (void *)0x0) {
        pcVar6 = pcVar6 + 1;
        goto LAB_0010a618;
      }
      goto LAB_0010a64c;
    }
    if (lVar8 == 3) {
      pvVar5 = memchr(" \t\r\n",(int)*pcVar6,5);
      pcVar10 = pcVar6;
      if (pvVar5 != (void *)0x0) {
        pcVar6 = pcVar6 + 1;
        goto LAB_0010a5fb;
      }
      goto LAB_0010a64c;
    }
LAB_0010a663:
    s->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  pcVar3 = (s->_M_dataplus)._M_p;
  uVar4 = s->_M_string_length;
  pcVar11 = pcVar3 + uVar4;
  lVar8 = (long)uVar4 >> 2;
  pcVar7 = pcVar11;
  if (0 < lVar8) {
    pcVar7 = pcVar11 + -(uVar4 & 0xfffffffffffffffc);
    pcVar11 = pcVar11 + lVar8 * -4;
    lVar8 = lVar8 + 1;
    do {
      pvVar5 = memchr(" \t\r\n",(int)pcVar3[uVar4 - 1],5);
      if (pvVar5 == (void *)0x0) {
        pcVar9 = pcVar3 + uVar4;
        goto LAB_0010a7e0;
      }
      pvVar5 = memchr(" \t\r\n",(int)pcVar3[uVar4 - 2],5);
      if (pvVar5 == (void *)0x0) {
        pcVar9 = pcVar3 + (uVar4 - 1);
        goto LAB_0010a7e0;
      }
      pvVar5 = memchr(" \t\r\n",(int)pcVar3[uVar4 - 3],5);
      if (pvVar5 == (void *)0x0) {
        pcVar9 = pcVar3 + (uVar4 - 2);
        goto LAB_0010a7e0;
      }
      pvVar5 = memchr(" \t\r\n",(int)pcVar3[uVar4 - 4],5);
      if (pvVar5 == (void *)0x0) {
        pcVar9 = pcVar3 + (uVar4 - 3);
        goto LAB_0010a7e0;
      }
      uVar4 = uVar4 - 4;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  lVar8 = (long)pcVar7 - (long)pcVar3;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      pcVar9 = pcVar3;
      if ((lVar8 != 3) ||
         (pvVar5 = memchr(" \t\r\n",(int)pcVar7[-1],5), pcVar9 = pcVar7, pvVar5 == (void *)0x0))
      goto LAB_0010a7e0;
      pcVar11 = pcVar11 + -1;
      pcVar7 = pcVar11;
    }
    pvVar5 = memchr(" \t\r\n",(int)pcVar7[-1],5);
    pcVar9 = pcVar7;
    if (pvVar5 == (void *)0x0) goto LAB_0010a7e0;
    pcVar7 = pcVar11 + -1;
  }
  pvVar5 = memchr(" \t\r\n",(int)pcVar7[-1],5);
  pcVar9 = pcVar7;
  if (pvVar5 != (void *)0x0) {
    pcVar9 = pcVar3;
  }
LAB_0010a7e0:
  s->_M_string_length = (long)pcVar9 - (long)pcVar3;
  *pcVar9 = '\0';
  return s->_M_string_length != 0;
}

Assistant:

bool trim(string& s)
{
	size_t pos;
	pos = s.find('#');
	if (pos != string::npos)
		s.erase(pos, s.size() - pos);

	// remove leading whitespace
	s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](int ch) {
		return !_isspace(ch);
	}));

	// remove trailing whitespace
	s.erase(std::find_if(s.rbegin(), s.rend(), [](int ch) {
		return !_isspace(ch);
	}).base(), s.end());

	return !s.empty();
}